

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_time(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_int64 local_28;
  time_t tt;
  jx9_value **apArg_local;
  jx9_context *pjStack_10;
  int nArg_local;
  jx9_context *pCtx_local;
  
  apArg_local._4_4_ = 0;
  tt = 0;
  pjStack_10 = pCtx;
  time(&local_28);
  jx9_result_int64(pjStack_10,local_28);
  return 0;
}

Assistant:

static int jx9Builtin_time(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	time_t tt;
	SXUNUSED(nArg); /* cc warning */
	SXUNUSED(apArg);
	/* Extract the current time */
	time(&tt);
	/* Return as 64-bit integer */
	jx9_result_int64(pCtx, (jx9_int64)tt);
	return  JX9_OK;
}